

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.h
# Opt level: O3

void __thiscall
slang::ast::StructuredAssignmentPatternExpression::
visitExprs<slang::analysis::SampledValueFuncVisitor&>
          (StructuredAssignmentPatternExpression *this,SampledValueFuncVisitor *visitor)

{
  size_t sVar1;
  pointer pMVar2;
  Expression *pEVar3;
  pointer pTVar4;
  IndexSetter *setter;
  pointer pIVar5;
  long lVar6;
  pointer pIVar7;
  
  sVar1 = (this->memberSetters)._M_extent._M_extent_value;
  if (sVar1 != 0) {
    pMVar2 = (this->memberSetters)._M_ptr;
    lVar6 = 0;
    do {
      pEVar3 = *(Expression **)((long)&(pMVar2->expr).ptr + lVar6);
      Expression::
      visitExpression<slang::ast::Expression_const,slang::analysis::SampledValueFuncVisitor&>
                (pEVar3,pEVar3,visitor);
      lVar6 = lVar6 + 0x10;
    } while (sVar1 << 4 != lVar6);
  }
  sVar1 = (this->typeSetters)._M_extent._M_extent_value;
  if (sVar1 != 0) {
    pTVar4 = (this->typeSetters)._M_ptr;
    lVar6 = 0;
    do {
      pEVar3 = *(Expression **)((long)&(pTVar4->expr).ptr + lVar6);
      Expression::
      visitExpression<slang::ast::Expression_const,slang::analysis::SampledValueFuncVisitor&>
                (pEVar3,pEVar3,visitor);
      lVar6 = lVar6 + 0x10;
    } while (sVar1 << 4 != lVar6);
  }
  sVar1 = (this->indexSetters)._M_extent._M_extent_value;
  if (sVar1 != 0) {
    pIVar5 = (this->indexSetters)._M_ptr;
    pIVar7 = pIVar5 + sVar1;
    do {
      pEVar3 = (pIVar5->index).ptr;
      Expression::
      visitExpression<slang::ast::Expression_const,slang::analysis::SampledValueFuncVisitor&>
                (pEVar3,pEVar3,visitor);
      pEVar3 = (pIVar5->expr).ptr;
      Expression::
      visitExpression<slang::ast::Expression_const,slang::analysis::SampledValueFuncVisitor&>
                (pEVar3,pEVar3,visitor);
      pIVar5 = pIVar5 + 1;
    } while (pIVar5 != pIVar7);
  }
  pEVar3 = this->defaultSetter;
  if (pEVar3 != (Expression *)0x0) {
    Expression::
    visitExpression<slang::ast::Expression_const,slang::analysis::SampledValueFuncVisitor&>
              (pEVar3,pEVar3,visitor);
    return;
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        for (auto& setter : memberSetters)
            setter.expr->visit(visitor);
        for (auto& setter : typeSetters)
            setter.expr->visit(visitor);
        for (auto& setter : indexSetters) {
            setter.index->visit(visitor);
            setter.expr->visit(visitor);
        }
        if (defaultSetter)
            defaultSetter->visit(visitor);
    }